

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O2

void __thiscall YAML::detail::node_data::node_data(node_data *this)

{
  this->m_isDefined = false;
  (this->m_mark).pos = -1;
  (this->m_mark).line = -1;
  *(undefined8 *)&(this->m_mark).column = 0x1ffffffff;
  (this->m_tag)._M_dataplus._M_p = (pointer)&(this->m_tag).field_2;
  (this->m_tag)._M_string_length = 0;
  (this->m_tag).field_2._M_local_buf[0] = '\0';
  this->m_style = Default;
  (this->m_scalar)._M_dataplus._M_p = (pointer)&(this->m_scalar).field_2;
  (this->m_scalar)._M_string_length = 0;
  (this->m_scalar).field_2._M_local_buf[0] = '\0';
  (this->m_sequence).super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sequence).super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sequence).super__Vector_base<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_seqSize = 0;
  (this->m_map).
  super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_map).
  super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_map).
  super__Vector_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_undefinedPairs).
  super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_undefinedPairs;
  (this->m_undefinedPairs).
  super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_undefinedPairs;
  (this->m_undefinedPairs).
  super__List_base<std::pair<YAML::detail::node_*,_YAML::detail::node_*>,_std::allocator<std::pair<YAML::detail::node_*,_YAML::detail::node_*>_>_>
  ._M_impl._M_node._M_size = 0;
  return;
}

Assistant:

node_data::node_data()
    : m_isDefined(false),
      m_mark(Mark::null_mark()),
      m_type(NodeType::Null),
      m_tag{},
      m_style(EmitterStyle::Default),
      m_scalar{},
      m_sequence{},
      m_seqSize(0),
      m_map{},
      m_undefinedPairs{} {}